

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::file::Base<njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::section::Type<26>>::
print<std::back_insert_iterator<std::__cxx11::string>>
          (Base<njoy::ENDFtk::file::Type<26>,njoy::ENDFtk::section::Type<26>> *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT)

{
  _Rb_tree_node_base *p_Var1;
  StructureDivision SStack_68;
  
  for (p_Var1 = *(_Rb_tree_node_base **)(this + 0x18); p_Var1 != (_Rb_tree_node_base *)(this + 8);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    ENDFtk::section::Type<26>::print<std::back_insert_iterator<std::__cxx11::string>>
              ((Type<26> *)&p_Var1[1]._M_parent,it,MAT,0x1a);
  }
  fileEndRecord(&SStack_68,MAT);
  StructureDivision::print<std::back_insert_iterator<std::__cxx11::string>>(&SStack_68,it);
  return;
}

Assistant:

void print( OutputIterator& it, int MAT ) const {

  int MF = this->MF();
  for ( const auto& entry : this->sections_ ) {

    Derived::printSection( entry.second, it, MAT, MF );
  }
  FEND( MAT ).print( it );
}